

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall sf::Window::create(Window *this,WindowHandle handle,ContextSettings *settings)

{
  WindowImpl *owner;
  GlContext *pGVar1;
  VideoMode VVar2;
  
  (*(this->super_WindowBase)._vptr_WindowBase[4])();
  WindowBase::create(&this->super_WindowBase,handle);
  owner = (this->super_WindowBase).m_impl;
  VVar2 = VideoMode::getDesktopMode();
  pGVar1 = priv::GlContext::create(settings,owner,VVar2.bitsPerPixel);
  this->m_context = pGVar1;
  initialize(this);
  return;
}

Assistant:

void Window::create(WindowHandle handle, const ContextSettings& settings)
{
    // Destroy the previous window implementation
    close();

    // Recreate the window implementation
    WindowBase::create(handle);

    // Recreate the context
    m_context = priv::GlContext::create(settings, m_impl, VideoMode::getDesktopMode().bitsPerPixel);

    // Perform common initializations
    initialize();
}